

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O0

int pem_write_DSAparams_i2d(void *x,uchar **outp)

{
  int iVar1;
  uchar **outp_local;
  void *x_local;
  
  iVar1 = i2d_DSAparams((DSA *)x,outp);
  return iVar1;
}

Assistant:

static EC_KEY *pkey_get_eckey(EVP_PKEY *key, EC_KEY **eckey) {
  EC_KEY *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_EC_KEY(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (eckey) {
    EC_KEY_free(*eckey);
    *eckey = dtmp;
  }
  return dtmp;
}